

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.h
# Opt level: O0

int mk_iov_add(mk_iov *mk_io,void *buf,int len,int free)

{
  int free_local;
  int len_local;
  void *buf_local;
  mk_iov *mk_io_local;
  
  mk_io->io[mk_io->iov_idx].iov_base = buf;
  mk_io->io[mk_io->iov_idx].iov_len = (long)len;
  mk_io->iov_idx = mk_io->iov_idx + 1;
  mk_io->total_len = (long)len + mk_io->total_len;
  if (free == 1) {
    _mk_iov_set_free(mk_io,buf);
  }
  if (mk_io->size < mk_io->iov_idx) {
    mk_io_local._4_4_ = -1;
  }
  else {
    mk_io_local._4_4_ = mk_io->iov_idx;
  }
  return mk_io_local._4_4_;
}

Assistant:

static inline int mk_iov_add(struct mk_iov *mk_io, void *buf, int len,
                             int free)
{
    mk_io->io[mk_io->iov_idx].iov_base = (unsigned char *) buf;
    mk_io->io[mk_io->iov_idx].iov_len = len;
    mk_io->iov_idx++;
    mk_io->total_len += len;

    if (free == MK_TRUE) {
        _mk_iov_set_free(mk_io, buf);
    }

    if (mk_io->iov_idx > mk_io->size) {
        MK_TRACE("[iov] buffer without space");
        return -1;
    }

    return mk_io->iov_idx;
}